

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema::Field&>
          (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           *this,ArrayPtr<const_kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                 table,Field *params)

{
  SegmentReader *pSVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  CapTableReader *pCVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  Entry *pEVar8;
  uint uVar9;
  unsigned_long *in_R8;
  ulong uVar10;
  Arena **ppAVar11;
  Maybe<unsigned_long> MVar12;
  ArrayPtr<const_unsigned_char> s;
  int local_30;
  undefined4 local_2c;
  
  aVar6.value = table.size_;
  pEVar8 = table.ptr;
  aVar7.value = aVar6.value;
  if ((pEVar8->key).proto._reader.capTable != (CapTableReader *)0x0) {
    local_30 = (int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8;
    local_2c = (undefined4)in_R8[1];
    s.size_ = 8;
    s.ptr = (uchar *)&local_30;
    uVar2 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
    uVar3 = kj::_::chooseBucket((uint)(uVar2 != 0),*(uint *)&(pEVar8->key).proto._reader.capTable);
    pSVar1 = (pEVar8->key).proto._reader.segment;
    uVar4 = (ulong)uVar3;
    uVar9 = *(uint *)((long)&pSVar1->arena + uVar4 * 8 + 4);
    aVar7 = extraout_RDX;
    if (uVar9 != 0) {
      ppAVar11 = &pSVar1->arena + uVar4;
      aVar7.value = *in_R8;
      do {
        if ((((uVar9 != 1) && (*(uint *)ppAVar11 == (uint)(uVar2 != 0))) &&
            (uVar10 = (ulong)(uVar9 - 2),
            *(unsigned_long *)(aVar6.value + uVar10 * 0x48) == aVar7.value)) &&
           (*(int *)(aVar6.value + 8 + uVar10 * 0x48) == (int)in_R8[1])) {
          *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = uVar10;
          goto LAB_001ebf62;
        }
        pCVar5 = (CapTableReader *)(uVar4 + 1);
        uVar4 = (ulong)pCVar5 & 0xffffffff;
        if (pCVar5 == (pEVar8->key).proto._reader.capTable) {
          uVar4 = 0;
        }
        ppAVar11 = &pSVar1->arena + uVar4;
        uVar9 = *(uint *)((long)ppAVar11 + 4);
      } while (uVar9 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>
           )0x0;
LAB_001ebf62:
  MVar12.ptr.field_1.value = aVar7.value;
  MVar12.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar12.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }